

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MOPSOFunction.cpp
# Opt level: O2

void putNewParticleIntoRep(Particle *particle,myRep *rep,int iterator)

{
  int n;
  bool bVar1;
  double **p2;
  ulong uVar2;
  double **p2_00;
  long lVar3;
  double **p2_01;
  Rep tmp;
  
  p2_00 = &particle->Position;
  p2 = &particle->addO_origin;
  p2_01 = &particle->Cost;
  for (lVar3 = 0; lVar3 < 5; lVar3 = lVar3 + 1) {
    if ((*(bool *)(p2_01 + 3) == false) && (bVar1 = canPutIntoRep(*p2_01,rep), bVar1)) {
      n = *(int *)(p2_01 + 5);
      uVar2 = (long)n * 8;
      if ((long)n < 0) {
        uVar2 = 0xffffffffffffffff;
      }
      tmp.addO_origin = (double *)operator_new__(uVar2);
      uVar2 = (long)*(int *)((long)p2_01 + 0x2c) * 8;
      if ((long)*(int *)((long)p2_01 + 0x2c) < 0) {
        uVar2 = 0xffffffffffffffff;
      }
      tmp.Position = (double *)operator_new__(uVar2);
      tmp.Cost = (double *)operator_new__(8);
      tmp.sizeOfAddO_origin = n;
      tmp.iterator = iterator;
      cpyDoubleArray(&tmp.addO_origin,p2,n);
      cpyDoubleArray(&tmp.Position,p2_00,*(int *)((long)p2_01 + 0x2c));
      cpyDoubleArray(&tmp.Cost,p2_01,1);
      std::__cxx11::list<Rep,_std::allocator<Rep>_>::push_back(rep,&tmp);
    }
    p2_00 = p2_00 + 0xf;
    p2 = p2 + 0xf;
    p2_01 = p2_01 + 0xf;
  }
  return;
}

Assistant:

void putNewParticleIntoRep(Particle * particle, myRep & rep, int iterator){
    for (int i=0; i<nPop; i++)
        if (!particle[i].dominated){
            if (canPutIntoRep(particle[i].Cost, rep)){
                Rep tmp;
                tmp.addO_origin = new double [particle[i].sizeOfAddO_origin];
                tmp.Position = new double [particle[i].sizeOfPosition];
                tmp.Cost = new double [numObjective];
                tmp.sizeOfAddO_origin = particle[i].sizeOfAddO_origin;
                tmp.iterator = iterator;
                cpyDoubleArray(tmp.addO_origin, particle[i].addO_origin, particle[i].sizeOfAddO_origin);
                cpyDoubleArray(tmp.Position, particle[i].Position, particle[i].sizeOfPosition);
                cpyDoubleArray(tmp.Cost, particle[i].Cost, numObjective);
                rep.push_back(tmp);
            }
        }
}